

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O1

bool __thiscall
duckdb::ColumnDataCollection::PrevScanIndex
          (ColumnDataCollection *this,ColumnDataScanState *state,idx_t *chunk_index,
          idx_t *segment_index,idx_t *row_index)

{
  const_reference pvVar1;
  pointer pCVar2;
  ulong uVar3;
  reference pvVar4;
  idx_t iVar5;
  bool bVar6;
  
  uVar3 = state->chunk_index;
  bVar6 = 1 < uVar3;
  if (bVar6) {
LAB_002c0caf:
    state->chunk_index = uVar3 - 1;
    *segment_index = state->segment_index;
    *chunk_index = state->chunk_index - 1;
    state->next_row_index = state->current_row_index;
    pvVar1 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
             ::operator[](&this->segments,state->segment_index);
    pCVar2 = unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
             ::operator->(pvVar1);
    pvVar4 = vector<duckdb::ChunkMetaData,_true>::operator[](&pCVar2->chunk_data,*chunk_index);
    iVar5 = state->current_row_index - (ulong)pvVar4->count;
    state->current_row_index = iVar5;
    *row_index = iVar5;
  }
  else {
    iVar5 = state->segment_index;
    if (iVar5 != 0) {
      do {
        state->segment_index = iVar5 - 1;
        pvVar1 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
                 ::operator[](&this->segments,iVar5 - 1);
        pCVar2 = unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
                 ::operator->(pvVar1);
        state->chunk_index =
             ((long)(pCVar2->chunk_data).
                    super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
                    super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar2->chunk_data).
                    super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
                    super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 + 1;
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)state);
        uVar3 = state->chunk_index;
        bVar6 = 1 < uVar3;
        if (bVar6) goto LAB_002c0caf;
        iVar5 = state->segment_index;
      } while (iVar5 != 0);
    }
  }
  return bVar6;
}

Assistant:

bool ColumnDataCollection::PrevScanIndex(ColumnDataScanState &state, idx_t &chunk_index, idx_t &segment_index,
                                         idx_t &row_index) const {
	// check within the current segment if we still have chunks to scan
	// Note that state.chunk_index is 1-indexed, with 0 as undefined.
	while (state.chunk_index <= 1) {
		if (!state.segment_index) {
			return false;
		}

		--state.segment_index;
		state.chunk_index = segments[state.segment_index]->chunk_data.size() + 1;
		state.current_chunk_state.handles.clear();
	}

	--state.chunk_index;
	segment_index = state.segment_index;
	chunk_index = state.chunk_index - 1;
	state.next_row_index = state.current_row_index;
	state.current_row_index -= segments[state.segment_index]->chunk_data[chunk_index].count;
	row_index = state.current_row_index;
	return true;
}